

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O1

void __thiscall draco::RAnsSymbolDecoder<4>::~RAnsSymbolDecoder(RAnsSymbolDecoder<4> *this)

{
  pointer prVar1;
  pointer puVar2;
  
  prVar1 = (this->ans_).probability_table_.
           super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (prVar1 != (pointer)0x0) {
    operator_delete(prVar1,(long)(this->ans_).probability_table_.
                                 super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)prVar1);
  }
  puVar2 = (this->ans_).lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->ans_).lut_table_.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->probability_table_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->probability_table_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    return;
  }
  return;
}

Assistant:

RAnsSymbolDecoder() : num_symbols_(0) {}